

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::ParseURL
               (string *URL,string *protocol,string *username,string *password,string *hostname,
               string *dataport,string *database,bool decode)

{
  bool bVar1;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  undefined4 local_288;
  undefined1 local_278 [8];
  RegularExpression urlRe;
  bool decode_local;
  string *dataport_local;
  string *hostname_local;
  string *password_local;
  string *username_local;
  string *protocol_local;
  string *URL_local;
  
  urlRe._559_1_ = decode;
  RegularExpression::RegularExpression
            ((RegularExpression *)local_278,
             "([a-zA-Z0-9]*)://(([A-Za-z0-9]+)(:([^:@]+))?@)?([^:@/]*)(:([0-9]+))?/(.+)?");
  bVar1 = RegularExpression::find((RegularExpression *)local_278,URL);
  if (bVar1) {
    RegularExpression::match_abi_cxx11_(&local_2a8,(RegularExpression *)local_278,1);
    std::__cxx11::string::operator=((string *)protocol,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    RegularExpression::match_abi_cxx11_(&local_2c8,(RegularExpression *)local_278,3);
    std::__cxx11::string::operator=((string *)username,(string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    RegularExpression::match_abi_cxx11_(&local_2e8,(RegularExpression *)local_278,5);
    std::__cxx11::string::operator=((string *)password,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    RegularExpression::match_abi_cxx11_(&local_308,(RegularExpression *)local_278,6);
    std::__cxx11::string::operator=((string *)hostname,(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    RegularExpression::match_abi_cxx11_(&local_328,(RegularExpression *)local_278,8);
    std::__cxx11::string::operator=((string *)dataport,(string *)&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    RegularExpression::match_abi_cxx11_(&local_348,(RegularExpression *)local_278,9);
    std::__cxx11::string::operator=((string *)database,(string *)&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    if ((urlRe._559_1_ & 1) != 0) {
      DecodeURL(&local_368,username);
      std::__cxx11::string::operator=((string *)username,(string *)&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      DecodeURL(&local_388,password);
      std::__cxx11::string::operator=((string *)password,(string *)&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      DecodeURL(&local_3a8,hostname);
      std::__cxx11::string::operator=((string *)hostname,(string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      DecodeURL(&local_3c8,dataport);
      std::__cxx11::string::operator=((string *)dataport,(string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      DecodeURL(&local_3e8,database);
      std::__cxx11::string::operator=((string *)database,(string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
    }
    URL_local._7_1_ = true;
  }
  else {
    URL_local._7_1_ = false;
  }
  local_288 = 1;
  RegularExpression::~RegularExpression((RegularExpression *)local_278);
  return URL_local._7_1_;
}

Assistant:

bool SystemTools::ParseURL(const std::string& URL, std::string& protocol,
                           std::string& username, std::string& password,
                           std::string& hostname, std::string& dataport,
                           std::string& database, bool decode)
{
  kwsys::RegularExpression urlRe(VTK_URL_REGEX);
  if (!urlRe.find(URL))
    return false;

  // match 0 URL
  // match 1 protocol
  // match 2 mangled user
  // match 3 username
  // match 4 mangled password
  // match 5 password
  // match 6 hostname
  // match 7 mangled port
  // match 8 dataport
  // match 9 database name

  protocol = urlRe.match(1);
  username = urlRe.match(3);
  password = urlRe.match(5);
  hostname = urlRe.match(6);
  dataport = urlRe.match(8);
  database = urlRe.match(9);

  if (decode) {
    username = DecodeURL(username);
    password = DecodeURL(password);
    hostname = DecodeURL(hostname);
    dataport = DecodeURL(dataport);
    database = DecodeURL(database);
  }

  return true;
}